

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::UnsafeShallowSwapExtension
          (ExtensionSet *this,ExtensionSet *other,int number)

{
  bool bVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  Arena *pAVar5;
  Arena *pAVar6;
  LogMessage *other_00;
  Extension *pEVar7;
  Extension *pEVar8;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar9;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  Extension *local_30;
  Extension *other_ext;
  Extension *this_ext;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *other_local;
  ExtensionSet *this_local;
  
  if (this != other) {
    this_ext._4_4_ = number;
    pEStack_18 = other;
    other_local = this;
    other_ext = FindOrNull(this,number);
    local_30 = FindOrNull(pEStack_18,this_ext._4_4_);
    if (other_ext != local_30) {
      pAVar5 = GetArena(this);
      pAVar6 = GetArena(pEStack_18);
      local_69 = 0;
      if (pAVar5 != pAVar6) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x4b9);
        local_69 = 1;
        other_00 = LogMessage::operator<<
                             (&local_68,"CHECK failed: (GetArena()) == (other->GetArena()): ");
        LogFinisher::operator=(local_7d,other_00);
      }
      if ((local_69 & 1) != 0) {
        LogMessage::~LogMessage(&local_68);
      }
      pEVar7 = other_ext;
      pEVar8 = local_30;
      if ((other_ext == (Extension *)0x0) || (local_30 == (Extension *)0x0)) {
        if (other_ext == (Extension *)0x0) {
          pVar9 = Insert(this,this_ext._4_4_);
          pEVar7 = pVar9.first;
          pEVar7->field_0 = pEVar8->field_0;
          bVar1 = pEVar8->is_repeated;
          uVar2 = pEVar8->field_0xa;
          bVar3 = pEVar8->is_packed;
          iVar4 = pEVar8->cached_size;
          pEVar7->type = pEVar8->type;
          pEVar7->is_repeated = bVar1;
          pEVar7->field_0xa = uVar2;
          pEVar7->is_packed = bVar3;
          pEVar7->cached_size = iVar4;
          pEVar7->descriptor = pEVar8->descriptor;
          Erase(pEStack_18,this_ext._4_4_);
        }
        else {
          pVar9 = Insert(pEStack_18,this_ext._4_4_);
          pEVar8 = pVar9.first;
          pEVar8->field_0 = pEVar7->field_0;
          bVar1 = pEVar7->is_repeated;
          uVar2 = pEVar7->field_0xa;
          bVar3 = pEVar7->is_packed;
          iVar4 = pEVar7->cached_size;
          pEVar8->type = pEVar7->type;
          pEVar8->is_repeated = bVar1;
          pEVar8->field_0xa = uVar2;
          pEVar8->is_packed = bVar3;
          pEVar8->cached_size = iVar4;
          pEVar8->descriptor = pEVar7->descriptor;
          Erase(this,this_ext._4_4_);
        }
      }
      else {
        std::swap<google::protobuf::internal::ExtensionSet::Extension>(other_ext,local_30);
      }
    }
  }
  return;
}

Assistant:

void ExtensionSet::UnsafeShallowSwapExtension(ExtensionSet* other, int number) {
  if (this == other) return;

  Extension* this_ext = FindOrNull(number);
  Extension* other_ext = other->FindOrNull(number);

  if (this_ext == other_ext) return;

  GOOGLE_DCHECK_EQ(GetArena(), other->GetArena());

  if (this_ext != nullptr && other_ext != nullptr) {
    std::swap(*this_ext, *other_ext);
  } else if (this_ext == nullptr) {
    *Insert(number).first = *other_ext;
    other->Erase(number);
  } else {
    *other->Insert(number).first = *this_ext;
    Erase(number);
  }
}